

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  Result RVar1;
  Index IVar2;
  Enum EVar3;
  Enum op;
  Location loc_1;
  Location loc;
  Var local_78;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
  Var::Var(&local_78,func_index,&loc_1);
  RVar1 = SharedValidator::OnCall(&this->validator_,&loc,&local_78);
  Var::~Var(&local_78);
  if (RVar1.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    IVar2 = num_func_imports(this);
    op = Call;
    if (func_index < IVar2) {
      op = InterpCallImport;
    }
    Istream::Emit(this->istream_,op,func_index);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnCallExpr(Index func_index) {
  CHECK_RESULT(
      validator_.OnCall(GetLocation(), Var(func_index, GetLocation())));

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::Call, func_index);
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
  }

  return Result::Ok;
}